

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O3

_Bool is_close_frame(uint16_t status_code,_Bool status_code_required)

{
  size_t sVar1;
  uint uVar2;
  uint8_t *puVar4;
  size_t i;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar9;
  ulong uVar10;
  undefined4 local_14;
  ulong uStack_10;
  uint8_t mask [4];
  uint_fast32_t aligned_mask;
  ulong uVar3;
  ulong uVar8;
  
  sVar1 = write_buffer_parse_pos;
  if (((char)write_buffer[write_buffer_parse_pos] < '\0') &&
     (sVar1 = write_buffer_parse_pos + 1, (write_buffer[write_buffer_parse_pos] & 8) != 0)) {
    sVar1 = write_buffer_parse_pos + 2;
    uVar2 = write_buffer[write_buffer_parse_pos + 1] & 0x7f;
    uVar3 = (ulong)uVar2;
    if (0x83 < (byte)((byte)uVar2 + 0x82)) {
      if ((char)write_buffer[write_buffer_parse_pos + 1] < '\0') {
        puVar4 = write_buffer + write_buffer_parse_pos + 6;
        local_14 = *(undefined4 *)(write_buffer + write_buffer_parse_pos + 2);
        uStack_10 = 0;
        if ((byte)uVar2 < 8) {
          uVar5 = 0;
          do {
            puVar4[uVar5] = puVar4[uVar5] ^ *(byte *)((long)&local_14 + (ulong)((uint)uVar5 & 3));
            uVar5 = uVar5 + 1;
          } while (uVar3 != uVar5);
        }
        else {
          uVar7 = -(int)puVar4 & 7;
          uVar8 = (ulong)uVar7;
          uVar5 = uVar3 - uVar8;
          lVar9 = 0;
          do {
            *(undefined1 *)((long)&stack0xfffffffffffffff0 + lVar9) =
                 *(undefined1 *)
                  ((long)&local_14 +
                  (ulong)((-0x160c66 - (int)write_buffer_parse_pos) + (int)lVar9 & 3));
            lVar9 = lVar9 + 1;
          } while (lVar9 != 8);
          uVar6 = (ulong)((uint)uVar5 & 7);
          if (uVar8 != 0) {
            lVar9 = 0;
            do {
              puVar4[lVar9] = puVar4[lVar9] ^ *(byte *)((long)&local_14 + (ulong)((uint)lVar9 & 3));
              lVar9 = lVar9 + 1;
            } while (uVar7 != (uint)lVar9);
          }
          if (7 < uVar5) {
            uVar10 = 0;
            do {
              *(ulong *)(puVar4 + uVar10 * 8 + uVar8) =
                   *(ulong *)(puVar4 + uVar10 * 8 + uVar8) ^ uStack_10;
              uVar10 = uVar10 + 1;
            } while (uVar5 >> 3 != uVar10);
          }
          if (uVar3 - uVar6 < uVar3) {
            lVar9 = -uVar6;
            do {
              write_buffer[lVar9 + write_buffer_parse_pos + uVar3 + 6] =
                   write_buffer[lVar9 + write_buffer_parse_pos + uVar3 + 6] ^
                   *(byte *)((long)&local_14 + (ulong)(uVar2 + (int)lVar9 & 3));
              lVar9 = lVar9 + 1;
            } while (lVar9 != 0);
          }
        }
        sVar1 = write_buffer_parse_pos + 6;
      }
      write_buffer_parse_pos = (uVar2 - 2 & 0xff) + sVar1 + 2;
      return *(uint16_t *)(write_buffer + sVar1) == status_code;
    }
  }
  write_buffer_parse_pos = sVar1;
  return false;
}

Assistant:

static bool is_close_frame(uint16_t status_code, bool status_code_required)
{
	if ((write_buffer[write_buffer_parse_pos] & WS_HEADER_FIN) != WS_HEADER_FIN) {
		return false;
	}

	if ((write_buffer[write_buffer_parse_pos++] & WS_CLOSE_FRAME) == 0) {
		return false;
	}

	uint8_t first_length = write_buffer[write_buffer_parse_pos++];
	bool is_masked = ((first_length & WS_MASK_SET) == WS_MASK_SET);
	first_length = first_length & (uint8_t)~WS_MASK_SET;
	if (first_length > CIO_WEBSOCKET_SMALL_FRAME_SIZE) {
		return false;
	}

	if ((first_length == 0) && (status_code_required)) {
		return false;
	}

	if (first_length == 1) {
		return false;
	}

	if (first_length > 0) {
		if (is_masked) {
			uint8_t mask[4];
			memcpy(mask, &write_buffer[write_buffer_parse_pos], sizeof(mask));
			write_buffer_parse_pos += sizeof(mask);
			cio_websocket_mask(&write_buffer[write_buffer_parse_pos], first_length, mask);
		}

		uint16_t sc;
		memcpy(&sc, &write_buffer[write_buffer_parse_pos], sizeof(sc));
		sc = cio_be16toh(sc);
		write_buffer_parse_pos += sizeof(sc);
		first_length = (uint8_t)(first_length - sizeof(sc));
		write_buffer_parse_pos += first_length;
		if (status_code != sc) {
			return false;
		}
	}

	return true;
}